

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avxvnni.cpp
# Opt level: O3

void ncnn::transpose_pack_B_tile_int8_avxvnni(Mat *B,Mat *BT,int j,int max_jj,int k,int max_kk)

{
  void *pvVar1;
  int iVar2;
  long lVar3;
  undefined1 (*pauVar4) [32];
  long lVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  ulong *puVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  undefined1 *puVar26;
  ulong uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 in_ZMM3 [64];
  long local_58;
  long local_50;
  
  iVar2 = cpu_support_x86_avx_vnni_int8();
  if (iVar2 != 0) {
    transpose_pack_B_tile_int8_avxvnniint8(B,BT,j,max_jj,k,max_kk);
    return;
  }
  iVar2 = B->w;
  lVar3 = (long)iVar2;
  pauVar4 = (undefined1 (*) [32])BT->data;
  uVar20 = 0;
  lVar5 = (long)k;
  lVar15 = (long)j;
  if (7 < max_jj) {
    lVar10 = (long)(iVar2 * 4);
    lVar13 = iVar2 * 3 + lVar15;
    lVar17 = lVar15 + iVar2 * 2;
    lVar18 = lVar3 + lVar15;
    auVar29[8] = 0x7f;
    auVar29._0_8_ = 0x7f7f7f7f7f7f7f7f;
    auVar29[9] = 0x7f;
    auVar29[10] = 0x7f;
    auVar29[0xb] = 0x7f;
    auVar29[0xc] = 0x7f;
    auVar29[0xd] = 0x7f;
    auVar29[0xe] = 0x7f;
    auVar29[0xf] = 0x7f;
    auVar29[0x10] = 0x7f;
    auVar29[0x11] = 0x7f;
    auVar29[0x12] = 0x7f;
    auVar29[0x13] = 0x7f;
    auVar29[0x14] = 0x7f;
    auVar29[0x15] = 0x7f;
    auVar29[0x16] = 0x7f;
    auVar29[0x17] = 0x7f;
    auVar29[0x18] = 0x7f;
    auVar29[0x19] = 0x7f;
    auVar29[0x1a] = 0x7f;
    auVar29[0x1b] = 0x7f;
    auVar29[0x1c] = 0x7f;
    auVar29[0x1d] = 0x7f;
    auVar29[0x1e] = 0x7f;
    auVar29[0x1f] = 0x7f;
    lVar25 = lVar15;
    uVar9 = 0;
    do {
      pvVar1 = B->data;
      lVar23 = B->w * lVar5 * B->elemsize;
      if (max_kk < 4) {
        lVar6 = (long)pvVar1 + lVar15 + uVar9;
        uVar8 = 0;
      }
      else {
        lVar6 = (long)pvVar1 + lVar25;
        lVar14 = lVar13 + (long)pvVar1;
        lVar16 = (long)pvVar1 + lVar17;
        lVar21 = (long)pvVar1 + lVar18;
        iVar7 = 3;
        do {
          auVar30._8_8_ = 0;
          auVar30._0_8_ = *(ulong *)(lVar6 + lVar23);
          auVar33._8_8_ = 0;
          auVar33._0_8_ = *(ulong *)(lVar21 + lVar23);
          auVar30 = vpunpcklbw_avx(auVar30,auVar33);
          auVar34._8_8_ = 0;
          auVar34._0_8_ = *(ulong *)(lVar16 + lVar23);
          auVar37._8_8_ = 0;
          auVar37._0_8_ = *(ulong *)(lVar14 + lVar23);
          auVar33 = vpunpcklbw_avx(auVar34,auVar37);
          auVar34 = vpunpcklwd_avx(auVar30,auVar33);
          in_ZMM3 = ZEXT1664(auVar34);
          auVar30 = vpunpckhwd_avx(auVar30,auVar33);
          auVar32._0_16_ = ZEXT116(0) * auVar30 + ZEXT116(1) * auVar34;
          auVar32._16_16_ = ZEXT116(1) * auVar30;
          auVar32 = vpaddb_avx2(auVar32,auVar29);
          *pauVar4 = auVar32;
          pauVar4 = pauVar4 + 1;
          lVar6 = lVar6 + lVar10;
          lVar14 = lVar14 + lVar10;
          lVar16 = lVar16 + lVar10;
          lVar21 = lVar21 + lVar10;
          iVar7 = iVar7 + 4;
          uVar8 = max_kk & 0xfffffffc;
        } while (iVar7 < max_kk);
      }
      puVar22 = (ulong *)(lVar6 + lVar23);
      uVar12 = uVar8 | 1;
      while ((int)uVar12 < max_kk) {
        auVar31._8_8_ = 0;
        auVar31._0_8_ = *puVar22;
        auVar35._8_8_ = 0;
        auVar35._0_8_ = *(ulong *)((long)puVar22 + lVar3);
        auVar30 = vpunpcklbw_avx(auVar31,auVar35);
        *(undefined1 (*) [16])*pauVar4 = auVar30;
        pauVar4 = (undefined1 (*) [32])(*pauVar4 + 0x10);
        puVar22 = (ulong *)((long)puVar22 + (long)(iVar2 * 2));
        uVar12 = uVar8 + 3;
        uVar8 = uVar8 + 2;
      }
      iVar7 = max_kk - uVar8;
      if (iVar7 != 0 && (int)uVar8 <= max_kk) {
        do {
          *(ulong *)*pauVar4 = *puVar22;
          pauVar4 = (undefined1 (*) [32])(*pauVar4 + 8);
          puVar22 = (ulong *)((long)puVar22 + lVar3);
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
      }
      uVar20 = uVar9 + 8;
      uVar27 = uVar9 + 0xf;
      lVar25 = lVar25 + 8;
      lVar13 = lVar13 + 8;
      lVar17 = lVar17 + 8;
      lVar18 = lVar18 + 8;
      uVar9 = uVar20;
    } while (uVar27 < (uint)max_jj);
  }
  auVar30 = _DAT_005a5b10;
  lVar17 = (long)max_jj;
  if ((int)((uint)uVar20 | 3) < max_jj) {
    auVar28._4_4_ = iVar2;
    auVar28._0_4_ = iVar2;
    auVar28._8_4_ = iVar2;
    auVar28._12_4_ = iVar2;
    vpmulld_avx(auVar28,_DAT_005a5590);
    auVar36[8] = 0x7f;
    auVar36._0_8_ = 0x7f7f7f7f7f7f7f7f;
    auVar36[9] = 0x7f;
    auVar36[10] = 0x7f;
    auVar36[0xb] = 0x7f;
    auVar36[0xc] = 0x7f;
    auVar36[0xd] = 0x7f;
    auVar36[0xe] = 0x7f;
    auVar36[0xf] = 0x7f;
    uVar9 = uVar20 & 0xffffffff;
    do {
      puVar26 = (undefined1 *)((long)B->data + lVar15 + uVar9 + B->w * lVar5 * B->elemsize);
      uVar8 = 0;
      if (3 < max_kk) {
        iVar7 = 3;
        do {
          auVar33 = vpcmpeqd_avx(in_ZMM3._0_16_,in_ZMM3._0_16_);
          auVar33 = vpgatherdd((undefined1  [16])0x0,auVar33);
          auVar33 = vpshufb_avx(auVar33,auVar30);
          auVar33 = vpaddb_avx(auVar33,auVar36);
          in_ZMM3 = ZEXT1664(auVar33);
          *(undefined1 (*) [16])*pauVar4 = auVar33;
          pauVar4 = (undefined1 (*) [32])(*pauVar4 + 0x10);
          puVar26 = puVar26 + lVar3 * 4;
          iVar7 = iVar7 + 4;
          uVar8 = max_kk & 0xfffffffc;
        } while (iVar7 < max_kk);
      }
      uVar12 = uVar8 | 1;
      while ((int)uVar12 < max_kk) {
        (*pauVar4)[0] = *puVar26;
        (*pauVar4)[1] = puVar26[lVar3];
        (*pauVar4)[2] = puVar26[1];
        (*pauVar4)[3] = puVar26[iVar2 + 1];
        (*pauVar4)[4] = puVar26[2];
        (*pauVar4)[5] = puVar26[iVar2 + 2];
        (*pauVar4)[6] = puVar26[3];
        (*pauVar4)[7] = puVar26[iVar2 + 3];
        pauVar4 = (undefined1 (*) [32])(*pauVar4 + 8);
        puVar26 = puVar26 + lVar3 * 2;
        uVar12 = uVar8 + 3;
        uVar8 = uVar8 + 2;
      }
      iVar7 = max_kk - uVar8;
      if (iVar7 != 0 && (int)uVar8 <= max_kk) {
        puVar26 = puVar26 + 3;
        do {
          (*pauVar4)[0] = puVar26[-3];
          (*pauVar4)[1] = puVar26[-2];
          (*pauVar4)[2] = puVar26[-1];
          (*pauVar4)[3] = *puVar26;
          pauVar4 = (undefined1 (*) [32])(*pauVar4 + 4);
          puVar26 = puVar26 + lVar3;
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
      }
      uVar20 = uVar9 + 4;
      lVar18 = uVar9 + 7;
      uVar9 = uVar20;
    } while (lVar18 < lVar17);
  }
  if ((int)((uint)uVar20 | 1) < max_jj) {
    lVar23 = (long)(iVar2 * 4);
    lVar18 = lVar15 + (uVar20 & 0xffffffff);
    lVar10 = (iVar2 * 3 + 1) + lVar18;
    lVar25 = (iVar2 + 1) + lVar18;
    lVar13 = iVar2 * 3 + lVar18;
    local_50 = iVar2 * 2 + lVar18;
    local_58 = lVar3 + lVar18;
    uVar9 = uVar20 & 0xffffffff;
    do {
      pvVar1 = B->data;
      lVar6 = B->w * lVar5 * B->elemsize;
      if (max_kk < 4) {
        lVar16 = (long)pvVar1 + lVar15 + uVar9;
        uVar8 = 0;
      }
      else {
        lVar16 = (long)pvVar1 + lVar18;
        lVar19 = lVar10 + (long)pvVar1;
        lVar14 = (long)pvVar1 + lVar25;
        lVar21 = (long)pvVar1 + lVar13;
        lVar24 = (long)pvVar1 + local_50;
        lVar11 = (long)pvVar1 + local_58;
        iVar7 = 3;
        do {
          (*pauVar4)[0] = *(char *)(lVar16 + lVar6) + '\x7f';
          (*pauVar4)[1] = *(char *)(lVar11 + lVar6) + '\x7f';
          (*pauVar4)[2] = *(char *)(lVar24 + lVar6) + '\x7f';
          (*pauVar4)[3] = *(char *)(lVar21 + lVar6) + '\x7f';
          (*pauVar4)[4] = *(char *)(lVar16 + 1 + lVar6) + '\x7f';
          (*pauVar4)[5] = *(char *)(lVar14 + lVar6) + '\x7f';
          (*pauVar4)[6] = *(char *)(lVar24 + 1 + lVar6) + '\x7f';
          (*pauVar4)[7] = *(char *)(lVar19 + lVar6) + '\x7f';
          pauVar4 = (undefined1 (*) [32])(*pauVar4 + 8);
          iVar7 = iVar7 + 4;
          lVar16 = lVar16 + lVar23;
          lVar19 = lVar19 + lVar23;
          lVar14 = lVar14 + lVar23;
          lVar21 = lVar21 + lVar23;
          lVar24 = lVar24 + lVar23;
          lVar11 = lVar11 + lVar23;
          uVar8 = max_kk & 0xfffffffc;
        } while (iVar7 < max_kk);
      }
      puVar26 = (undefined1 *)(lVar16 + lVar6);
      uVar12 = uVar8 | 1;
      while ((int)uVar12 < max_kk) {
        (*pauVar4)[0] = *puVar26;
        (*pauVar4)[1] = puVar26[lVar3];
        (*pauVar4)[2] = puVar26[1];
        (*pauVar4)[3] = puVar26[iVar2 + 1];
        pauVar4 = (undefined1 (*) [32])(*pauVar4 + 4);
        puVar26 = puVar26 + iVar2 * 2;
        uVar12 = uVar8 + 3;
        uVar8 = uVar8 + 2;
      }
      iVar7 = max_kk - uVar8;
      if (iVar7 != 0 && (int)uVar8 <= max_kk) {
        puVar26 = puVar26 + 1;
        do {
          (*pauVar4)[0] = puVar26[-1];
          (*pauVar4)[1] = *puVar26;
          pauVar4 = (undefined1 (*) [32])(*pauVar4 + 2);
          puVar26 = puVar26 + lVar3;
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
      }
      uVar20 = uVar9 + 2;
      lVar6 = uVar9 + 3;
      lVar18 = lVar18 + 2;
      lVar10 = lVar10 + 2;
      lVar25 = lVar25 + 2;
      lVar13 = lVar13 + 2;
      local_50 = local_50 + 2;
      local_58 = local_58 + 2;
      uVar9 = uVar20;
    } while (lVar6 < lVar17);
  }
  if ((int)uVar20 < max_jj) {
    lVar13 = (long)(iVar2 * 4);
    lVar6 = (long)(int)uVar20;
    lVar18 = lVar6 + lVar15;
    lVar10 = iVar2 * 3 + lVar18;
    lVar23 = iVar2 * 2 + lVar18;
    lVar25 = lVar18 + lVar3;
    do {
      pvVar1 = B->data;
      lVar16 = B->w * lVar5 * B->elemsize;
      if (max_kk < 4) {
        lVar14 = (long)pvVar1 + lVar15 + lVar6;
        uVar8 = 0;
      }
      else {
        lVar14 = (long)pvVar1 + lVar18;
        lVar21 = (long)pvVar1 + lVar10;
        lVar24 = (long)pvVar1 + lVar23;
        lVar11 = (long)pvVar1 + lVar25;
        iVar2 = 3;
        do {
          (*pauVar4)[0] = *(char *)(lVar14 + lVar16) + '\x7f';
          (*pauVar4)[1] = *(char *)(lVar11 + lVar16) + '\x7f';
          (*pauVar4)[2] = *(char *)(lVar24 + lVar16) + '\x7f';
          (*pauVar4)[3] = *(char *)(lVar21 + lVar16) + '\x7f';
          pauVar4 = (undefined1 (*) [32])(*pauVar4 + 4);
          iVar2 = iVar2 + 4;
          lVar14 = lVar14 + lVar13;
          lVar21 = lVar21 + lVar13;
          lVar24 = lVar24 + lVar13;
          lVar11 = lVar11 + lVar13;
          uVar8 = max_kk & 0xfffffffc;
        } while (iVar2 < max_kk);
      }
      puVar26 = (undefined1 *)(lVar14 + lVar16);
      iVar2 = max_kk - uVar8;
      if (iVar2 != 0 && (int)uVar8 <= max_kk) {
        do {
          (*pauVar4)[0] = *puVar26;
          pauVar4 = (undefined1 (*) [32])(*pauVar4 + 1);
          puVar26 = puVar26 + lVar3;
          iVar2 = iVar2 + -1;
        } while (iVar2 != 0);
      }
      lVar6 = lVar6 + 1;
      lVar18 = lVar18 + 1;
      lVar10 = lVar10 + 1;
      lVar23 = lVar23 + 1;
      lVar25 = lVar25 + 1;
    } while (lVar6 != lVar17);
  }
  return;
}

Assistant:

void transpose_pack_B_tile_int8_avxvnni(const Mat& B, Mat& BT, int j, int max_jj, int k, int max_kk)
{
    transpose_pack_B_tile_int8(B, BT, j, max_jj, k, max_kk);
}